

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

void compute_avg_log_variance
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bs,double *avg_log_src_variance,
               double *avg_log_recon_variance)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int is_hbd_00;
  int iVar7;
  int iVar8;
  int iVar9;
  double *pdVar10;
  double *in_RCX;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  double *in_R8;
  aom_variance_fn_t vf_00;
  double dVar11;
  int blocks;
  int recon_var;
  double log_src_var;
  int src_var;
  Block4x4VarInfo *block_4x4_var_info;
  int mi_offset;
  int c;
  int j;
  int r;
  int i;
  aom_variance_fn_t vf;
  int is_hbd;
  int bh;
  int bw;
  int bottom_overflow;
  int right_overflow;
  int mi_col_in_sb;
  int mi_row_in_sb;
  BLOCK_SIZE sb_size;
  MACROBLOCKD *xd;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int local_64;
  int local_5c;
  
  bVar1 = *(byte *)(*(long *)(in_RDI + 0x42008) + 0x1c);
  uVar4 = *(uint *)(in_RSI + 0x1a0);
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bVar1];
  uVar5 = *(uint *)(in_RSI + 0x1a4);
  bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bVar1];
  if (*(int *)(in_RSI + 0x2098) < 0) {
    iVar6 = -*(int *)(in_RSI + 0x2098) >> 3;
  }
  else {
    iVar6 = 0;
  }
  if (*(int *)(in_RSI + 0x20a0) < 0) {
    is_hbd_00 = -*(int *)(in_RSI + 0x20a0) >> 3;
  }
  else {
    is_hbd_00 = 0;
  }
  iVar7 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_DL]
          * 4 - iVar6;
  iVar8 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_DL]
          * 4 - is_hbd_00;
  is_cur_buf_hbd((MACROBLOCKD *)(in_RSI + 0x1a0));
  for (local_5c = 0; local_5c < iVar8; local_5c = local_5c + 4) {
    for (local_64 = 0; local_64 < iVar7; local_64 = local_64 + 4) {
      pdVar10 = (double *)
                (*(long *)(in_RSI + 0x25688) +
                (long)(int)(((uVar4 & bVar2 - 1) + (local_5c >> 2)) *
                            (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                  [bVar1] + (uVar5 & bVar3 - 1) + (local_64 >> 2)) * 0x10);
      vf_00 = (aom_variance_fn_t)*pdVar10;
      if (*(int *)(pdVar10 + 1) < 0) {
        iVar9 = av1_calc_normalized_variance
                          (vf_00,(uint8_t *)
                                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),iVar6
                           ,is_hbd_00);
        *(int *)(pdVar10 + 1) = iVar9;
        vf_00 = (aom_variance_fn_t)log1p((double)iVar9 / 16.0);
        *pdVar10 = (double)vf_00;
      }
      else if ((double)vf_00 < 0.0) {
        vf_00 = (aom_variance_fn_t)log1p((double)*(int *)(pdVar10 + 1) / 16.0);
        *pdVar10 = (double)vf_00;
      }
      *in_RCX = (double)vf_00 + *in_RCX;
      in_stack_ffffffffffffff74 =
           av1_calc_normalized_variance
                     (vf_00,(uint8_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                      ,iVar6,is_hbd_00);
      dVar11 = log1p((double)in_stack_ffffffffffffff74 / 16.0);
      *in_R8 = dVar11 + *in_R8;
    }
  }
  iVar6 = (iVar7 * iVar8) / 0x10;
  *in_RCX = *in_RCX / (double)iVar6;
  *in_R8 = *in_R8 / (double)iVar6;
  return;
}

Assistant:

static void compute_avg_log_variance(const AV1_COMP *const cpi, MACROBLOCK *x,
                                     const BLOCK_SIZE bs,
                                     double *avg_log_src_variance,
                                     double *avg_log_recon_variance) {
  const MACROBLOCKD *const xd = &x->e_mbd;
  const BLOCK_SIZE sb_size = cpi->common.seq_params->sb_size;
  const int mi_row_in_sb = x->e_mbd.mi_row & (mi_size_high[sb_size] - 1);
  const int mi_col_in_sb = x->e_mbd.mi_col & (mi_size_wide[sb_size] - 1);
  const int right_overflow =
      (xd->mb_to_right_edge < 0) ? ((-xd->mb_to_right_edge) >> 3) : 0;
  const int bottom_overflow =
      (xd->mb_to_bottom_edge < 0) ? ((-xd->mb_to_bottom_edge) >> 3) : 0;
  const int bw = (MI_SIZE * mi_size_wide[bs] - right_overflow);
  const int bh = (MI_SIZE * mi_size_high[bs] - bottom_overflow);
  const int is_hbd = is_cur_buf_hbd(xd);

  aom_variance_fn_t vf = cpi->ppi->fn_ptr[BLOCK_4X4].vf;
  for (int i = 0; i < bh; i += MI_SIZE) {
    const int r = mi_row_in_sb + (i >> MI_SIZE_LOG2);
    for (int j = 0; j < bw; j += MI_SIZE) {
      const int c = mi_col_in_sb + (j >> MI_SIZE_LOG2);
      const int mi_offset = r * mi_size_wide[sb_size] + c;
      Block4x4VarInfo *block_4x4_var_info =
          &x->src_var_info_of_4x4_sub_blocks[mi_offset];
      int src_var = block_4x4_var_info->var;
      double log_src_var = block_4x4_var_info->log_var;
      // Compute average of log(1 + variance) for the source block from 4x4
      // sub-block variance values. Calculate and store 4x4 sub-block variance
      // and log(1 + variance), if the values present in
      // src_var_of_4x4_sub_blocks are invalid. Reuse the same if it is readily
      // available with valid values.
      if (src_var < 0) {
        src_var = av1_calc_normalized_variance(
            vf, x->plane[0].src.buf + i * x->plane[0].src.stride + j,
            x->plane[0].src.stride, is_hbd);
        block_4x4_var_info->var = src_var;
        log_src_var = log1p(src_var / 16.0);
        block_4x4_var_info->log_var = log_src_var;
      } else {
        // When source variance is already calculated and available for
        // retrieval, check if log(1 + variance) is also available. If it is
        // available, then retrieve from buffer. Else, calculate the same and
        // store to the buffer.
        if (log_src_var < 0) {
          log_src_var = log1p(src_var / 16.0);
          block_4x4_var_info->log_var = log_src_var;
        }
      }
      *avg_log_src_variance += log_src_var;

      const int recon_var = av1_calc_normalized_variance(
          vf, xd->plane[0].dst.buf + i * xd->plane[0].dst.stride + j,
          xd->plane[0].dst.stride, is_hbd);
      *avg_log_recon_variance += log1p(recon_var / 16.0);
    }
  }

  const int blocks = (bw * bh) / 16;
  *avg_log_src_variance /= (double)blocks;
  *avg_log_recon_variance /= (double)blocks;
}